

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_negsol.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  sunrealtype *psVar2;
  int iVar3;
  long *returnvalue;
  long *returnvalue_00;
  void *returnvalue_01;
  void *returnvalue_02;
  int iVar4;
  double dVar5;
  int retval;
  SUNContext sunctx;
  double local_60;
  int check_negative;
  sunrealtype t;
  void *local_48;
  void *local_40;
  void *local_38;
  
  retval = SUNContext_Create(0,&sunctx);
  iVar4 = 1;
  iVar3 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar3 == 0) {
    returnvalue = (long *)N_VNew_Serial(3,sunctx);
    iVar3 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar3 == 0) {
      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
      *puVar1 = 0x3ff0000000000000;
      puVar1[1] = 0;
      puVar1[2] = 0;
      returnvalue_00 = (long *)N_VNew_Serial(3,sunctx);
      iVar3 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar3 == 0) {
        puVar1 = *(undefined8 **)(*returnvalue_00 + 0x10);
        *puVar1 = 0x3e7ad7f29abcaf48;
        puVar1[1] = 0x3d3c25c268497682;
        puVar1[2] = 0x3ee4f8b588e368f1;
        returnvalue_01 = (void *)CVodeCreate(2,sunctx);
        local_38 = returnvalue_01;
        iVar3 = check_retval(returnvalue_01,"CVodeCreate",0);
        if (iVar3 == 0) {
          retval = CVodeInit(0,returnvalue_01,f,returnvalue);
          iVar4 = 1;
          iVar3 = check_retval(&retval,"CVodeInit",1);
          if (iVar3 == 0) {
            retval = CVodeSVtolerances(0x3f1a36e2eb1c432d,returnvalue_01,returnvalue_00);
            iVar4 = 1;
            iVar3 = check_retval(&retval,"CVodeSVtolerances",1);
            if (iVar3 == 0) {
              retval = CVodeSetUserData(returnvalue_01,&check_negative);
              iVar4 = 1;
              iVar3 = check_retval(&retval,"CVodeSetUserData",1);
              if (iVar3 == 0) {
                returnvalue_02 = (void *)SUNDenseMatrix(3,3,sunctx);
                iVar3 = check_retval(returnvalue_02,"SUNDenseMatrix",0);
                if (iVar3 == 0) {
                  local_48 = (void *)SUNLinSol_Dense(returnvalue,returnvalue_02,sunctx);
                  iVar3 = check_retval(local_48,"SUNLinSol_Dense",0);
                  if (iVar3 == 0) {
                    retval = CVodeSetLinearSolver(returnvalue_01,local_48,returnvalue_02);
                    iVar4 = 1;
                    iVar3 = check_retval(&retval,"CVodeSetLinearSolver",1);
                    if (iVar3 == 0) {
                      local_40 = returnvalue_02;
                      puts("Ignore negative solution components\n");
                      check_negative = 0;
                      dVar5 = 0.4;
                      iVar3 = 0xe;
                      do {
                        local_60 = dVar5;
                        retval = CVode(dVar5,returnvalue_01,returnvalue,&t,1);
                        psVar2 = *(sunrealtype **)(*returnvalue + 0x10);
                        PrintOutput(t,*psVar2,psVar2[1],psVar2[2]);
                        dVar5 = local_60 * 10.0;
                        iVar3 = iVar3 + -1;
                      } while (iVar3 != 0);
                      PrintFinalStats(returnvalue_01);
                      puts("Intercept negative solution components\n");
                      check_negative = 1;
                      puVar1 = *(undefined8 **)(*returnvalue + 0x10);
                      *puVar1 = 0x3ff0000000000000;
                      puVar1[1] = 0;
                      puVar1[2] = 0;
                      retval = CVodeReInit(0,returnvalue_01,returnvalue);
                      dVar5 = 0.4;
                      iVar3 = 0xe;
                      do {
                        local_60 = dVar5;
                        CVode(dVar5,returnvalue_01,returnvalue,&t,1);
                        psVar2 = *(sunrealtype **)(*returnvalue + 0x10);
                        PrintOutput(t,*psVar2,psVar2[1],psVar2[2]);
                        dVar5 = local_60 * 10.0;
                        iVar3 = iVar3 + -1;
                      } while (iVar3 != 0);
                      PrintFinalStats(returnvalue_01);
                      N_VDestroy(returnvalue);
                      N_VDestroy(returnvalue_00);
                      CVodeFree(&local_38);
                      SUNLinSolFree(local_48);
                      SUNMatDestroy(local_40);
                      SUNContext_Free(&sunctx);
                      iVar4 = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  N_Vector abstol;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  sunbooleantype check_negative;

  y         = NULL;
  abstol    = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  NV_Ith_S(y, 0) = Y1;
  NV_Ith_S(y, 1) = Y2;
  NV_Ith_S(y, 2) = Y3;

  /* Set the vector absolute tolerance */
  abstol = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)abstol, "N_VNew_Serial", 0)) { return (1); }

  NV_Ith_S(abstol, 0) = ATOL1;
  NV_Ith_S(abstol, 1) = ATOL2;
  NV_Ith_S(abstol, 2) = ATOL3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSVtolerances to specify the scalar relative tolerance
   * and vector absolute tolerances */
  retval = CVodeSVtolerances(cvode_mem, RTOL, abstol);
  if (check_retval(&retval, "CVodeSVtolerances", 1)) { return (1); }

  /* Call CVodeSetUserData to pass the check negative retval as user data */
  retval = CVodeSetUserData(cvode_mem, &check_negative);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Case 1: ignore negative solution components */
  printf("Ignore negative solution components\n\n");
  check_negative = SUNFALSE;
  /* In loop, call CVode in CV_NORMAL mode */
  iout = 0;
  tout = T1;
  while (1)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    iout++;
    tout *= TMULT;
    if (iout == NOUT) { break; }
  }
  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* Case 2: intercept negative solution components */
  printf("Intercept negative solution components\n\n");
  check_negative = SUNTRUE;
  /* Reinitialize solver */
  NV_Ith_S(y, 0) = Y1;
  NV_Ith_S(y, 1) = Y2;
  NV_Ith_S(y, 2) = Y3;
  retval         = CVodeReInit(cvode_mem, T0, y);
  /* In loop, call CVode in CV_NORMAL mode */
  iout = 0;
  tout = T1;
  while (1)
  {
    CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    iout++;
    tout *= TMULT;
    if (iout == NOUT) { break; }
  }
  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(y);            /* Free y vector */
  N_VDestroy(abstol);       /* Free abstol vector */
  CVodeFree(&cvode_mem);    /* Free CVODE memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}